

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void __thiscall uint256_tests::methods::test_method(methods *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  bool bVar1;
  uint256 *puVar2;
  uint160 *puVar3;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd8f8;
  char *in_stack_ffffffffffffd900;
  undefined1 *puVar4;
  char *pcVar5;
  char *in_stack_ffffffffffffd908;
  base_blob<256U> *in_stack_ffffffffffffd910;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd918;
  char *pcVar7;
  const_string *in_stack_ffffffffffffd920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd928;
  undefined7 in_stack_ffffffffffffd930;
  undefined1 in_stack_ffffffffffffd937;
  lazy_ostream *in_stack_ffffffffffffd938;
  undefined7 in_stack_ffffffffffffd948;
  undefined1 in_stack_ffffffffffffd94f;
  base_blob<256U> *in_stack_ffffffffffffd950;
  undefined7 in_stack_ffffffffffffd9a0;
  undefined1 in_stack_ffffffffffffd9a7;
  uchar *in_stack_ffffffffffffd9a8;
  uchar *in_stack_ffffffffffffd9b0;
  undefined7 in_stack_ffffffffffffd9b8;
  undefined1 in_stack_ffffffffffffd9bf;
  uchar *in_stack_ffffffffffffd9c0;
  equal_coll_impl *in_stack_ffffffffffffd9c8;
  methods *this_local;
  undefined1 local_1c58 [16];
  undefined1 local_1c48 [71];
  allocator<char> local_1c01;
  undefined1 local_1c00 [16];
  undefined1 local_1bf0 [64];
  undefined1 local_1bb0 [16];
  undefined1 local_1ba0 [71];
  allocator<char> local_1b59;
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [64];
  undefined1 local_1b08 [16];
  undefined1 local_1af8 [71];
  allocator<char> local_1ab1;
  undefined1 local_1ab0 [16];
  undefined1 local_1aa0 [68];
  lazy_ostream local_1a5c;
  undefined1 local_1a40 [68];
  lazy_ostream local_19fc;
  undefined1 local_19e0 [64];
  undefined1 local_19a0 [8];
  uchar *local_1998;
  undefined1 local_1990 [16];
  undefined1 local_1980 [64];
  undefined1 local_1940 [8];
  uchar *local_1938;
  undefined1 local_1930 [16];
  undefined1 local_1920 [64];
  undefined1 local_18e0 [8];
  uchar *local_18d8;
  undefined1 local_18d0 [16];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [8];
  uchar *local_1878;
  undefined1 local_1870 [16];
  undefined1 local_1860 [64];
  undefined1 local_1820 [8];
  uchar *local_1818;
  undefined1 local_1810 [16];
  undefined1 local_1800 [64];
  lazy_ostream local_17c0;
  undefined1 local_17a8 [64];
  lazy_ostream local_1768;
  undefined1 local_1750 [64];
  lazy_ostream local_1710;
  undefined1 local_16f8 [64];
  lazy_ostream local_16b8;
  undefined1 local_16a0 [68];
  lazy_ostream local_165c;
  undefined1 local_1640 [64];
  lazy_ostream local_1600;
  undefined1 local_15f0 [16];
  undefined1 local_15e0 [64];
  const_string local_15a0;
  lazy_ostream local_1590 [2];
  assertion_result local_1568 [2];
  const_string local_1530;
  lazy_ostream local_1520 [2];
  assertion_result local_14f8 [2];
  const_string local_14c0;
  lazy_ostream local_14b0 [2];
  assertion_result local_1488 [2];
  const_string local_1450;
  lazy_ostream local_1440 [2];
  assertion_result local_1418 [2];
  const_string local_13e0;
  lazy_ostream local_13d0 [2];
  assertion_result local_13a8 [2];
  undefined1 local_1370 [16];
  undefined1 local_1360 [64];
  undefined1 local_1320 [16];
  undefined1 local_1310 [64];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [16];
  undefined1 local_1270 [64];
  undefined1 local_1230 [16];
  undefined1 local_1220 [64];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [64];
  undefined1 local_1190 [16];
  undefined1 local_1180 [64];
  undefined1 local_1140 [16];
  undefined1 local_1130 [71];
  allocator<char> local_10e9;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [64];
  undefined1 local_1098 [16];
  undefined1 local_1088 [71];
  allocator<char> local_1041;
  undefined1 local_1040 [16];
  undefined1 local_1030 [48];
  undefined8 local_1000;
  undefined1 local_ff0 [16];
  undefined1 local_fe0 [71];
  allocator<char> local_f99;
  undefined1 local_f98 [16];
  undefined1 local_f88 [64];
  DataStream ss;
  lazy_ostream local_f1c;
  undefined1 local_f00 [68];
  lazy_ostream local_ebc;
  undefined1 local_ea0 [64];
  undefined1 local_e60 [8];
  uchar *local_e58;
  undefined1 local_e50 [16];
  undefined1 local_e40 [64];
  undefined1 local_e00 [8];
  uchar *local_df8;
  undefined1 local_df0 [16];
  undefined1 local_de0 [64];
  undefined1 local_da0 [8];
  uchar *local_d98;
  undefined1 local_d90 [16];
  undefined1 local_d80 [64];
  undefined1 local_d40 [8];
  uchar *local_d38;
  undefined1 local_d30 [16];
  undefined1 local_d20 [64];
  undefined1 local_ce0 [8];
  uchar *local_cd8;
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [64];
  lazy_ostream local_c80;
  undefined1 local_c68 [64];
  lazy_ostream local_c28;
  undefined1 local_c10 [64];
  lazy_ostream local_bd0;
  undefined1 local_bb8 [64];
  lazy_ostream local_b78;
  undefined1 local_b60 [68];
  lazy_ostream local_b1c;
  undefined1 local_b00 [64];
  lazy_ostream local_ac0;
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [64];
  const_string local_a60;
  lazy_ostream local_a50 [2];
  assertion_result local_a28 [2];
  const_string local_9f0;
  lazy_ostream local_9e0 [2];
  assertion_result local_9b8 [2];
  const_string local_980;
  lazy_ostream local_970 [2];
  assertion_result local_948 [2];
  const_string local_910;
  lazy_ostream local_900 [2];
  assertion_result local_8d8 [2];
  const_string local_8a0;
  lazy_ostream local_890 [2];
  assertion_result local_868 [2];
  undefined1 local_830 [16];
  undefined1 local_820 [64];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [64];
  undefined1 local_790 [16];
  undefined1 local_780 [80];
  undefined1 local_730 [16];
  undefined1 local_720 [64];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [64];
  undefined1 local_690 [16];
  undefined1 local_680 [64];
  undefined1 local_640 [16];
  undefined1 local_630 [64];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [64];
  lazy_ostream local_5a0 [2];
  undefined1 local_580 [32];
  lazy_ostream local_560 [2];
  undefined1 local_540 [32];
  lazy_ostream local_520 [2];
  undefined1 local_500 [88];
  lazy_ostream local_4a8;
  undefined4 local_498;
  uint160 TmpS;
  lazy_ostream local_400 [2];
  undefined1 local_3e0 [32];
  lazy_ostream local_3c0 [2];
  undefined1 local_3a0 [32];
  lazy_ostream local_380 [2];
  undefined1 local_360 [32];
  lazy_ostream local_340 [2];
  undefined1 local_320 [32];
  lazy_ostream local_300 [2];
  undefined1 local_2e0 [32];
  lazy_ostream local_2c0 [2];
  undefined1 local_2a0 [32];
  lazy_ostream local_280 [2];
  undefined1 local_260 [104];
  lazy_ostream local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_148 [32];
  uint256 TmpL;
  lazy_ostream local_108 [2];
  undefined1 local_e8 [32];
  lazy_ostream local_c8 [2];
  undefined1 local_a8 [32];
  lazy_ostream local_88 [2];
  undefined1 local_68 [32];
  lazy_ostream local_48 [2];
  undefined1 local_28 [32];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd900,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_ffffffffffffd910);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffd900);
    in_stack_ffffffffffffd908 = "R1L.ToString()";
    in_stack_ffffffffffffd900 = (char *)local_48;
    in_stack_ffffffffffffd8f8 = "R1L.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_5e0,local_5f0,0x98,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd900,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_ffffffffffffd910);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffd900);
    in_stack_ffffffffffffd908 = "R2L.ToString()";
    in_stack_ffffffffffffd900 = (char *)local_88;
    in_stack_ffffffffffffd8f8 = "R2L.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_630,local_640,0x99,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd900,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_ffffffffffffd910);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffd900);
    in_stack_ffffffffffffd908 = "OneL.ToString()";
    in_stack_ffffffffffffd900 = (char *)local_c8;
    in_stack_ffffffffffffd8f8 = "OneL.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_680,local_690,0x9a,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd900,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_ffffffffffffd910);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffd900);
    in_stack_ffffffffffffd908 = "MaxL.ToString()";
    in_stack_ffffffffffffd900 = (char *)local_108;
    in_stack_ffffffffffffd8f8 = "MaxL.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_6d0,local_6e0,0x9b,1,2,local_e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TmpL.super_base_blob<256U>.m_data._M_elems[0] = (uchar)R1L;
  TmpL.super_base_blob<256U>.m_data._M_elems[1] = R1L._1_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[2] = R1L._2_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[3] = R1L._3_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[4] = R1L._4_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[5] = R1L._5_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[6] = R1L._6_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[7] = R1L._7_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[8] = (uchar)DAT_023d60f1;
  TmpL.super_base_blob<256U>.m_data._M_elems[9] = DAT_023d60f1._1_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[10] = DAT_023d60f1._2_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = DAT_023d60f1._3_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = DAT_023d60f1._4_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = DAT_023d60f1._5_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = DAT_023d60f1._6_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = DAT_023d60f1._7_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)DAT_023d60f9;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = DAT_023d60f9._1_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = DAT_023d60f9._2_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = DAT_023d60f9._3_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = DAT_023d60f9._4_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = DAT_023d60f9._5_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = DAT_023d60f9._6_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = DAT_023d60f9._7_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)DAT_023d6101;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = DAT_023d6101._1_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = DAT_023d6101._2_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = DAT_023d6101._3_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = DAT_023d6101._4_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = DAT_023d6101._5_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = DAT_023d6101._6_1_;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = DAT_023d6101._7_1_;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd900,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R1L";
    in_stack_ffffffffffffd900 = (char *)&R1L;
    in_stack_ffffffffffffd8f8 = "TmpL";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_720,local_730,0x9d,1,2,&TmpL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffd918,
             (char *)in_stack_ffffffffffffd910);
  str_05._M_len._7_1_ = in_stack_ffffffffffffd9a7;
  str_05._M_len._0_7_ = in_stack_ffffffffffffd9a0;
  str_05._M_str = (char *)in_stack_ffffffffffffd9a8;
  base_blob<256U>::SetHexDeprecated(in_stack_ffffffffffffd950,str_05);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd900,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffd900);
    in_stack_ffffffffffffd908 =
         "\"0000000000000000000000000000000000000000000000000000000000000021\"";
    in_stack_ffffffffffffd900 = "0000000000000000000000000000000000000000000000000000000000000021";
    in_stack_ffffffffffffd8f8 = "TmpL.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_780,local_790,0xa0,1,2,local_148);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    puVar4 = in_stack_ffffffffffffd900;
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)puVar4);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffd918);
    str._M_str = (char *)in_stack_ffffffffffffd918;
    str._M_len = (size_t)in_stack_ffffffffffffd910;
    uint256::FromHex(str);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffd908);
    in_stack_ffffffffffffd908 = "R2L";
    puVar4 = R2L;
    in_stack_ffffffffffffd8f8 = "uint256::FromHex(R2L.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_7d0,local_7e0,0xa1,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    pcVar5 = puVar4;
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pcVar5);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffd918);
    str_00._M_str = (char *)in_stack_ffffffffffffd918;
    str_00._M_len = (size_t)in_stack_ffffffffffffd910;
    uint256::FromHex(str_00);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffd908);
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1f8._vptr_lazy_ostream = (_func_int **)0x0;
    local_1f8.m_empty = false;
    local_1f8._9_7_ = 0;
    uint256::uint256((uint256 *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "uint256()";
    pcVar5 = (char *)&local_1f8;
    in_stack_ffffffffffffd8f8 = "uint256::FromHex(ZeroL.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_820,local_830,0xa2,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pcVar5);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffd918);
  str_01._M_str = (char *)in_stack_ffffffffffffd918;
  str_01._M_len = (size_t)in_stack_ffffffffffffd910;
  uint256::FromHex(str_01);
  puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffd908);
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R1L.end()";
    pcVar5 = "R1L.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_868,local_890,&local_8a0,0xa5,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpL.end()";
    pcVar5 = "TmpL.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_8d8,local_900,&local_910,0xa6,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R2L.end()";
    pcVar5 = "R2L.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_948,local_970,&local_980,0xa7,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "ZeroL.end()";
    pcVar5 = "ZeroL.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_9b8,local_9e0,&local_9f0,0xa8,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    base_blob<256U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    pcVar7 = "OneArray + uint256::size()";
    pcVar6 = "OneArray";
    in_stack_ffffffffffffd908 = "OneL.end()";
    pcVar5 = "OneL.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_a28,local_a50,&local_a60,0xa9,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    puVar4 = pcVar5;
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_ac0._12_4_ = base_blob<256U>::size();
    local_ac0._vptr_lazy_ostream = (_func_int **)0x20;
    in_stack_ffffffffffffd908 = "sizeof(R1L)";
    puVar4 = (undefined1 *)&local_ac0;
    in_stack_ffffffffffffd8f8 = "R1L.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
              (local_aa0,local_ab0,0xaa,1,2,&local_ac0.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_b1c._4_8_ = 0x20;
    local_b1c._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_b1c;
    in_stack_ffffffffffffd8f8 = "sizeof(R1L)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_b00,&local_b1c.field_0xc,0xab,1,2,
               (undefined1 *)((long)&local_b1c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_b78._vptr_lazy_ostream._4_4_ = base_blob<256U>::size();
    local_b78._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_b78;
    in_stack_ffffffffffffd8f8 = "R1L.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_b60,&local_b78.m_empty,0xac,1,2,
               (undefined1 *)((long)&local_b78._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_bd0._vptr_lazy_ostream._4_4_ = base_blob<256U>::size();
    local_bd0._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_bd0;
    in_stack_ffffffffffffd8f8 = "R2L.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_bb8,&local_bd0.m_empty,0xad,1,2,
               (undefined1 *)((long)&local_bd0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_c28._vptr_lazy_ostream._4_4_ = base_blob<256U>::size();
    local_c28._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_c28;
    in_stack_ffffffffffffd8f8 = "ZeroL.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_c10,&local_c28.m_empty,0xae,1,2,
               (undefined1 *)((long)&local_c28._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_c80._vptr_lazy_ostream._4_4_ = base_blob<256U>::size();
    local_c80._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_c80;
    in_stack_ffffffffffffd8f8 = "MaxL.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_c68,&local_c80.m_empty,0xaf,1,2,
               (undefined1 *)((long)&local_c80._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_cd8 = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    local_cd8 = local_cd8 + 0x20;
    local_ce0 = (undefined1  [8])base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R1L.end()";
    puVar4 = local_ce0;
    in_stack_ffffffffffffd8f8 = "R1L.begin() + 32";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_cc0,local_cd0,0xb0,1,2,&local_cd8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_d38 = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    local_d38 = local_d38 + 0x20;
    local_d40 = (undefined1  [8])base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R2L.end()";
    puVar4 = local_d40;
    in_stack_ffffffffffffd8f8 = "R2L.begin() + 32";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_d20,local_d30,0xb1,1,2,&local_d38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_d98 = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    local_d98 = local_d98 + 0x20;
    local_da0 = (undefined1  [8])base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "OneL.end()";
    puVar4 = local_da0;
    in_stack_ffffffffffffd8f8 = "OneL.begin() + 32";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_d80,local_d90,0xb2,1,2,&local_d98);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_df8 = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    local_df8 = local_df8 + 0x20;
    local_e00 = (undefined1  [8])base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "MaxL.end()";
    puVar4 = local_e00;
    in_stack_ffffffffffffd8f8 = "MaxL.begin() + 32";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_de0,local_df0,0xb3,1,2,&local_df8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_e58 = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    local_e58 = local_e58 + 0x20;
    local_e60 = (undefined1  [8])base_blob<256U>::end((base_blob<256U> *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpL.end()";
    puVar4 = local_e60;
    in_stack_ffffffffffffd8f8 = "TmpL.begin() + 32";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char*,unsigned_char*>
              (local_e40,local_e50,0xb4,1,2,&local_e58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_ebc._4_8_ = GetSerializeSize<uint256>((uint256 *)puVar4);
    local_ebc._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_ebc;
    in_stack_ffffffffffffd8f8 = "GetSerializeSize(R1L)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_ea0,&local_ebc.field_0xc,0xb5,1,2,
               (undefined1 *)((long)&local_ebc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_f1c._4_8_ = GetSerializeSize<uint256>((uint256 *)puVar4);
    local_f1c._vptr_lazy_ostream._0_4_ = 0x20;
    in_stack_ffffffffffffd908 = "32";
    puVar4 = (undefined1 *)&local_f1c;
    in_stack_ffffffffffffd8f8 = "GetSerializeSize(ZeroL)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_f00,&local_f1c.field_0xc,0xb6,1,2,
               (undefined1 *)((long)&local_f1c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss.m_read_pos = 0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffd8f8);
  DataStream::operator<<((DataStream *)in_stack_ffffffffffffd908,(uint256 *)puVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    DataStream::str_abi_cxx11_
              ((DataStream *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              (in_stack_ffffffffffffd928,(uchar *)in_stack_ffffffffffffd920,(uchar *)pcVar7,
               (allocator<char> *)pcVar6);
    in_stack_ffffffffffffd908 = "std::string(R1Array,R1Array+32)";
    puVar4 = (undefined1 *)local_280;
    in_stack_ffffffffffffd8f8 = "ss.str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_f88,local_f98,0xba,1,2,local_260);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::allocator<char>::~allocator(&local_f99);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator>>((DataStream *)in_stack_ffffffffffffd908,(uint256 *)puVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpL";
    puVar4 = (undefined1 *)&TmpL;
    in_stack_ffffffffffffd8f8 = "R1L";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_fe0,local_ff0,0xbc,1,2,&R1L);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd8f8);
  DataStream::operator<<((DataStream *)in_stack_ffffffffffffd908,(uint256 *)puVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    DataStream::str_abi_cxx11_
              ((DataStream *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              (in_stack_ffffffffffffd928,(uchar *)in_stack_ffffffffffffd920,(uchar *)pcVar7,
               (allocator<char> *)pcVar6);
    in_stack_ffffffffffffd908 = "std::string(ZeroArray,ZeroArray+32)";
    puVar4 = (undefined1 *)local_2c0;
    in_stack_ffffffffffffd8f8 = "ss.str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1030,local_1040,0xbf,1,2,local_2a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::allocator<char>::~allocator(&local_1041);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator>>((DataStream *)in_stack_ffffffffffffd908,(uint256 *)puVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpL";
    puVar4 = (undefined1 *)&TmpL;
    in_stack_ffffffffffffd8f8 = "ZeroL";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1088,local_1098,0xc1,1,2,ZeroL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd8f8);
  DataStream::operator<<((DataStream *)in_stack_ffffffffffffd908,(uint256 *)puVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    DataStream::str_abi_cxx11_
              ((DataStream *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              (in_stack_ffffffffffffd928,(uchar *)in_stack_ffffffffffffd920,(uchar *)pcVar7,
               (allocator<char> *)pcVar6);
    in_stack_ffffffffffffd908 = "std::string(MaxArray,MaxArray+32)";
    puVar4 = (undefined1 *)local_300;
    in_stack_ffffffffffffd8f8 = "ss.str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_10d8,local_10e8,0xc4,1,2,local_2e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::allocator<char>::~allocator(&local_10e9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator>>((DataStream *)in_stack_ffffffffffffd908,(uint256 *)puVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpL";
    puVar4 = (undefined1 *)&TmpL;
    in_stack_ffffffffffffd8f8 = "MaxL";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1130,local_1140,0xc6,1,2,MaxL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd8f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<160u>::GetHex_abi_cxx11_((base_blob<160U> *)pcVar6);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)puVar4);
    in_stack_ffffffffffffd908 = "R1S.ToString()";
    puVar4 = (undefined1 *)local_340;
    in_stack_ffffffffffffd8f8 = "R1S.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1180,local_1190,0xc9,1,2,local_320);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<160u>::GetHex_abi_cxx11_((base_blob<160U> *)pcVar6);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)puVar4);
    in_stack_ffffffffffffd908 = "R2S.ToString()";
    puVar4 = (undefined1 *)local_380;
    in_stack_ffffffffffffd8f8 = "R2S.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_11d0,local_11e0,0xca,1,2,local_360);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<160u>::GetHex_abi_cxx11_((base_blob<160U> *)pcVar6);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)puVar4);
    in_stack_ffffffffffffd908 = "OneS.ToString()";
    puVar4 = (undefined1 *)local_3c0;
    in_stack_ffffffffffffd8f8 = "OneS.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1220,local_1230,0xcb,1,2,local_3a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<160u>::GetHex_abi_cxx11_((base_blob<160U> *)pcVar6);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)puVar4);
    in_stack_ffffffffffffd908 = "MaxS.ToString()";
    puVar4 = (undefined1 *)local_400;
    in_stack_ffffffffffffd8f8 = "MaxS.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1270,local_1280,0xcc,1,2,local_3e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = (uchar)R1S;
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = R1S._1_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = R1S._2_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = R1S._3_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = R1S._4_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = R1S._5_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = R1S._6_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = R1S._7_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = (uchar)DAT_023d6111;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = DAT_023d6111._1_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = DAT_023d6111._2_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = DAT_023d6111._3_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = DAT_023d6111._4_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = DAT_023d6111._5_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = DAT_023d6111._6_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = DAT_023d6111._7_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = (uchar)DAT_023d6119;
  TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = DAT_023d6119._1_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = DAT_023d6119._2_1_;
  TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = DAT_023d6119._3_1_;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R1S";
    puVar4 = (undefined1 *)&R1S;
    in_stack_ffffffffffffd8f8 = "TmpS";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_12c0,local_12d0,0xce,1,2,&TmpS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)puVar4,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,puVar4,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)puVar4);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
    str_02._M_str = pcVar7;
    str_02._M_len = (size_t)pcVar6;
    uint160::FromHex(str_02);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffd908);
    in_stack_ffffffffffffd908 = "R2S";
    puVar4 = R2S;
    in_stack_ffffffffffffd8f8 = "uint160::FromHex(R2S.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1310,local_1320,0xcf,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    pcVar5 = puVar4;
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)pcVar5);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
    str_03._M_str = pcVar7;
    str_03._M_len = (size_t)pcVar6;
    uint160::FromHex(str_03);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffd908);
    local_4a8._vptr_lazy_ostream = (_func_int **)0x0;
    local_4a8.m_empty = false;
    local_4a8._9_7_ = 0;
    local_498 = 0;
    uint160::uint160((uint160 *)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "uint160()";
    pcVar5 = (char *)&local_4a8;
    in_stack_ffffffffffffd8f8 = "uint160::FromHex(ZeroS.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1360,local_1370,0xd0,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)pcVar5);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
  str_04._M_str = pcVar7;
  str_04._M_len = (size_t)pcVar6;
  uint160::FromHex(str_04);
  puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffd908);
  TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(puVar3->super_base_blob<160U>).m_data._M_elems;
  TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((puVar3->super_base_blob<160U>).m_data._M_elems + 8);
  TmpS.super_base_blob<160U>.m_data._M_elems._16_4_ =
       *(undefined4 *)((puVar3->super_base_blob<160U>).m_data._M_elems + 0x10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R1S.end()";
    pcVar5 = "R1S.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_13a8,local_13d0,&local_13e0,0xd3,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpS.end()";
    pcVar5 = "TmpS.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_1418,local_1440,&local_1450,0xd4,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "R2S.end()";
    pcVar5 = "R2S.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_1488,local_14b0,&local_14c0,0xd5,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "ZeroS.end()";
    pcVar5 = "ZeroS.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_14f8,local_1520,&local_1530,0xd6,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    base_blob<160U>::size();
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,
               (uchar *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
               in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    pcVar7 = "OneArray + uint160::size()";
    pcVar6 = "OneArray";
    in_stack_ffffffffffffd908 = "OneS.end()";
    pcVar5 = "OneS.begin()";
    in_stack_ffffffffffffd8f8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_1568,local_1590,&local_15a0,0xd7,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1600._12_4_ = base_blob<160U>::size();
    local_1600._vptr_lazy_ostream = (_func_int **)0x14;
    in_stack_ffffffffffffd908 = "sizeof(R1S)";
    pcVar5 = (char *)&local_1600;
    in_stack_ffffffffffffd8f8 = "R1S.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
              (local_15e0,local_15f0,0xd8,1,2,&local_1600.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_165c._4_8_ = 0x14;
    local_165c._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_165c;
    in_stack_ffffffffffffd8f8 = "sizeof(R1S)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_1640,&local_165c.field_0xc,0xd9,1,2,
               (undefined1 *)((long)&local_165c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_16b8._vptr_lazy_ostream._4_4_ = base_blob<160U>::size();
    local_16b8._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_16b8;
    in_stack_ffffffffffffd8f8 = "R1S.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_16a0,&local_16b8.m_empty,0xda,1,2,
               (undefined1 *)((long)&local_16b8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1710._vptr_lazy_ostream._4_4_ = base_blob<160U>::size();
    local_1710._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_1710;
    in_stack_ffffffffffffd8f8 = "R2S.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_16f8,&local_1710.m_empty,0xdb,1,2,
               (undefined1 *)((long)&local_1710._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1768._vptr_lazy_ostream._4_4_ = base_blob<160U>::size();
    local_1768._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_1768;
    in_stack_ffffffffffffd8f8 = "ZeroS.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_1750,&local_1768.m_empty,0xdc,1,2,
               (undefined1 *)((long)&local_1768._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_17c0._vptr_lazy_ostream._4_4_ = base_blob<160U>::size();
    local_17c0._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_17c0;
    in_stack_ffffffffffffd8f8 = "MaxS.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_17a8,&local_17c0.m_empty,0xdd,1,2,
               (undefined1 *)((long)&local_17c0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1818 = base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    local_1818 = local_1818 + 0x14;
    local_1820 = (undefined1  [8])base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8)
    ;
    in_stack_ffffffffffffd908 = "R1S.end()";
    pcVar5 = local_1820;
    in_stack_ffffffffffffd8f8 = "R1S.begin() + 20";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_1800,local_1810,0xde,1,2,&local_1818);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1878 = base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    local_1878 = local_1878 + 0x14;
    local_1880 = (undefined1  [8])base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8)
    ;
    in_stack_ffffffffffffd908 = "R2S.end()";
    pcVar5 = local_1880;
    in_stack_ffffffffffffd8f8 = "R2S.begin() + 20";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_1860,local_1870,0xdf,1,2,&local_1878);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_18d8 = base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    local_18d8 = local_18d8 + 0x14;
    local_18e0 = (undefined1  [8])base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8)
    ;
    in_stack_ffffffffffffd908 = "OneS.end()";
    pcVar5 = local_18e0;
    in_stack_ffffffffffffd8f8 = "OneS.begin() + 20";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_18c0,local_18d0,0xe0,1,2,&local_18d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1938 = base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    local_1938 = local_1938 + 0x14;
    local_1940 = (undefined1  [8])base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8)
    ;
    in_stack_ffffffffffffd908 = "MaxS.end()";
    pcVar5 = local_1940;
    in_stack_ffffffffffffd8f8 = "MaxS.begin() + 20";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
              (local_1920,local_1930,0xe1,1,2,&local_1938);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1998 = base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffd8f8);
    local_1998 = local_1998 + 0x14;
    local_19a0 = (undefined1  [8])base_blob<160U>::end((base_blob<160U> *)in_stack_ffffffffffffd8f8)
    ;
    in_stack_ffffffffffffd908 = "TmpS.end()";
    pcVar5 = local_19a0;
    in_stack_ffffffffffffd8f8 = "TmpS.begin() + 20";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char*,unsigned_char*>
              (local_1980,local_1990,0xe2,1,2,&local_1998);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_19fc._4_8_ = GetSerializeSize<uint160>((uint160 *)pcVar5);
    local_19fc._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_19fc;
    in_stack_ffffffffffffd8f8 = "GetSerializeSize(R1S)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_19e0,&local_19fc.field_0xc,0xe3,1,2,
               (undefined1 *)((long)&local_19fc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    local_1a5c._4_8_ = GetSerializeSize<uint160>((uint160 *)pcVar5);
    local_1a5c._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_ffffffffffffd908 = "20";
    pcVar5 = (char *)&local_1a5c;
    in_stack_ffffffffffffd8f8 = "GetSerializeSize(ZeroS)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_1a40,&local_1a5c.field_0xc,0xe4,1,2,
               (undefined1 *)((long)&local_1a5c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator<<((DataStream *)in_stack_ffffffffffffd908,(uint160 *)pcVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    DataStream::str_abi_cxx11_
              ((DataStream *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              (in_stack_ffffffffffffd928,(uchar *)in_stack_ffffffffffffd920,(uchar *)pcVar7,
               (allocator<char> *)pcVar6);
    in_stack_ffffffffffffd908 = "std::string(R1Array,R1Array+20)";
    pcVar5 = (char *)local_520;
    in_stack_ffffffffffffd8f8 = "ss.str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1aa0,local_1ab0,0xe7,1,2,local_500);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::allocator<char>::~allocator(&local_1ab1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator>>((DataStream *)in_stack_ffffffffffffd908,(uint160 *)pcVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpS";
    pcVar5 = (char *)&TmpS;
    in_stack_ffffffffffffd8f8 = "R1S";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1af8,local_1b08,0xe9,1,2,&R1S);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd8f8);
  DataStream::operator<<((DataStream *)in_stack_ffffffffffffd908,(uint160 *)pcVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    DataStream::str_abi_cxx11_
              ((DataStream *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              (in_stack_ffffffffffffd928,(uchar *)in_stack_ffffffffffffd920,(uchar *)pcVar7,
               (allocator<char> *)pcVar6);
    in_stack_ffffffffffffd908 = "std::string(ZeroArray,ZeroArray+20)";
    pcVar5 = (char *)local_560;
    in_stack_ffffffffffffd8f8 = "ss.str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1b48,local_1b58,0xec,1,2,local_540);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::allocator<char>::~allocator(&local_1b59);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator>>((DataStream *)in_stack_ffffffffffffd908,(uint160 *)pcVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpS";
    pcVar5 = (char *)&TmpS;
    in_stack_ffffffffffffd8f8 = "ZeroS";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1ba0,local_1bb0,0xee,1,2,ZeroS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd8f8);
  DataStream::operator<<((DataStream *)in_stack_ffffffffffffd908,(uint160 *)pcVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    DataStream::str_abi_cxx11_
              ((DataStream *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              (in_stack_ffffffffffffd928,(uchar *)in_stack_ffffffffffffd920,(uchar *)pcVar7,
               (allocator<char> *)pcVar6);
    in_stack_ffffffffffffd908 = "std::string(MaxArray,MaxArray+20)";
    pcVar5 = (char *)local_5a0;
    in_stack_ffffffffffffd8f8 = "ss.str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1bf0,local_1c00,0xf1,1,2,local_580);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    std::allocator<char>::~allocator(&local_1c01);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd94f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffd94f);
  DataStream::operator>>((DataStream *)in_stack_ffffffffffffd908,(uint160 *)pcVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd938,
               (const_string *)CONCAT17(in_stack_ffffffffffffd937,in_stack_ffffffffffffd930),
               (size_t)in_stack_ffffffffffffd928,in_stack_ffffffffffffd920);
    in_stack_ffffffffffffd938 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pcVar5,(char (*) [1])in_stack_ffffffffffffd8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd908,pcVar5,
               (unsigned_long)in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd908 = "TmpS";
    pcVar5 = (char *)&TmpS;
    in_stack_ffffffffffffd8f8 = "MaxS";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1c48,local_1c58,0xf3,1,2,MaxS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd8f8);
    in_stack_ffffffffffffd937 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffd937);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd8f8);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffd8f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(methods) // GetHex SetHexDeprecated FromHex begin() end() size() GetLow64 GetSerializeSize, Serialize, Unserialize
{
    BOOST_CHECK_EQUAL(R1L.GetHex(), R1L.ToString());
    BOOST_CHECK_EQUAL(R2L.GetHex(), R2L.ToString());
    BOOST_CHECK_EQUAL(OneL.GetHex(), OneL.ToString());
    BOOST_CHECK_EQUAL(MaxL.GetHex(), MaxL.ToString());
    uint256 TmpL(R1L);
    BOOST_CHECK_EQUAL(TmpL, R1L);
    // Verify previous values don't persist when setting to truncated string.
    TmpL.SetHexDeprecated("21");
    BOOST_CHECK_EQUAL(TmpL.ToString(), "0000000000000000000000000000000000000000000000000000000000000021");
    BOOST_CHECK_EQUAL(uint256::FromHex(R2L.ToString()).value(), R2L);
    BOOST_CHECK_EQUAL(uint256::FromHex(ZeroL.ToString()).value(), uint256());

    TmpL = uint256::FromHex(R1L.ToString()).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(R1L.begin(), R1L.end(), R1Array, R1Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(TmpL.begin(), TmpL.end(), R1Array, R1Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(R2L.begin(), R2L.end(), R2Array, R2Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(ZeroL.begin(), ZeroL.end(), ZeroArray, ZeroArray + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(OneL.begin(), OneL.end(), OneArray, OneArray + uint256::size());
    BOOST_CHECK_EQUAL(R1L.size(), sizeof(R1L));
    BOOST_CHECK_EQUAL(sizeof(R1L), 32);
    BOOST_CHECK_EQUAL(R1L.size(), 32);
    BOOST_CHECK_EQUAL(R2L.size(), 32);
    BOOST_CHECK_EQUAL(ZeroL.size(), 32);
    BOOST_CHECK_EQUAL(MaxL.size(), 32);
    BOOST_CHECK_EQUAL(R1L.begin() + 32, R1L.end());
    BOOST_CHECK_EQUAL(R2L.begin() + 32, R2L.end());
    BOOST_CHECK_EQUAL(OneL.begin() + 32, OneL.end());
    BOOST_CHECK_EQUAL(MaxL.begin() + 32, MaxL.end());
    BOOST_CHECK_EQUAL(TmpL.begin() + 32, TmpL.end());
    BOOST_CHECK_EQUAL(GetSerializeSize(R1L), 32);
    BOOST_CHECK_EQUAL(GetSerializeSize(ZeroL), 32);

    DataStream ss{};
    ss << R1L;
    BOOST_CHECK_EQUAL(ss.str(), std::string(R1Array,R1Array+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(R1L, TmpL);
    ss.clear();
    ss << ZeroL;
    BOOST_CHECK_EQUAL(ss.str(), std::string(ZeroArray,ZeroArray+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(ZeroL, TmpL);
    ss.clear();
    ss << MaxL;
    BOOST_CHECK_EQUAL(ss.str(), std::string(MaxArray,MaxArray+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(MaxL, TmpL);
    ss.clear();

    BOOST_CHECK_EQUAL(R1S.GetHex(), R1S.ToString());
    BOOST_CHECK_EQUAL(R2S.GetHex(), R2S.ToString());
    BOOST_CHECK_EQUAL(OneS.GetHex(), OneS.ToString());
    BOOST_CHECK_EQUAL(MaxS.GetHex(), MaxS.ToString());
    uint160 TmpS(R1S);
    BOOST_CHECK_EQUAL(TmpS, R1S);
    BOOST_CHECK_EQUAL(uint160::FromHex(R2S.ToString()).value(), R2S);
    BOOST_CHECK_EQUAL(uint160::FromHex(ZeroS.ToString()).value(), uint160());

    TmpS = uint160::FromHex(R1S.ToString()).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(R1S.begin(), R1S.end(), R1Array, R1Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(TmpS.begin(), TmpS.end(), R1Array, R1Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(R2S.begin(), R2S.end(), R2Array, R2Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(ZeroS.begin(), ZeroS.end(), ZeroArray, ZeroArray + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(OneS.begin(), OneS.end(), OneArray, OneArray + uint160::size());
    BOOST_CHECK_EQUAL(R1S.size(), sizeof(R1S));
    BOOST_CHECK_EQUAL(sizeof(R1S), 20);
    BOOST_CHECK_EQUAL(R1S.size(), 20);
    BOOST_CHECK_EQUAL(R2S.size(), 20);
    BOOST_CHECK_EQUAL(ZeroS.size(), 20);
    BOOST_CHECK_EQUAL(MaxS.size(), 20);
    BOOST_CHECK_EQUAL(R1S.begin() + 20, R1S.end());
    BOOST_CHECK_EQUAL(R2S.begin() + 20, R2S.end());
    BOOST_CHECK_EQUAL(OneS.begin() + 20, OneS.end());
    BOOST_CHECK_EQUAL(MaxS.begin() + 20, MaxS.end());
    BOOST_CHECK_EQUAL(TmpS.begin() + 20, TmpS.end());
    BOOST_CHECK_EQUAL(GetSerializeSize(R1S), 20);
    BOOST_CHECK_EQUAL(GetSerializeSize(ZeroS), 20);

    ss << R1S;
    BOOST_CHECK_EQUAL(ss.str(), std::string(R1Array,R1Array+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(R1S, TmpS);
    ss.clear();
    ss << ZeroS;
    BOOST_CHECK_EQUAL(ss.str(), std::string(ZeroArray,ZeroArray+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(ZeroS, TmpS);
    ss.clear();
    ss << MaxS;
    BOOST_CHECK_EQUAL(ss.str(), std::string(MaxArray,MaxArray+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(MaxS, TmpS);
    ss.clear();
}